

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ggwave.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ggwave_ProtocolId gVar5;
  uint uVar6;
  int iVar7;
  ggwave_Parameters *pgVar8;
  undefined8 *puVar9;
  uchar *puVar10;
  char *pcVar11;
  byte *pbVar12;
  Protocols *this;
  void *__src;
  long in_RSI;
  int in_EDI;
  int i_2;
  TxRxData result_2;
  uint8_t *p_2;
  uint32_t nBytes_2;
  uint32_t expectedSize_2;
  GGWave instance_2;
  Parameters parameters_2;
  int length_1;
  int i_1;
  TxRxData result_1;
  uint8_t *p_1;
  uint32_t nBytes_1;
  uint32_t expectedSize_1;
  GGWave instance_1;
  Parameters parameters_1;
  int length;
  Protocol *protocol;
  int protocolId;
  anon_enum_32 *formatInp;
  iterator __end2;
  iterator __begin2;
  set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
  *__range2;
  anon_enum_32 *formatOut;
  iterator __end1;
  iterator __begin1;
  set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
  *__range1;
  string payload;
  int i;
  TxRxData result;
  GGWave instanceInp;
  uint8_t *p;
  uint32_t nBytes;
  uint32_t expectedSize;
  GGWave instanceOut;
  string payload_2;
  Parameters parameters;
  int srInp;
  string payload_1;
  GGWave instance;
  anon_class_8_1_4eff857e addNoiseHelper;
  anon_class_8_1_4eff857e convertHelper;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  bool full;
  set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
  *in_stack_ffffffffffffdfd8;
  undefined4 in_stack_ffffffffffffdfe0;
  uint in_stack_ffffffffffffdfe4;
  undefined4 in_stack_ffffffffffffdff0;
  uint in_stack_ffffffffffffdff4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffdff8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffe000;
  void *in_stack_ffffffffffffe008;
  undefined4 in_stack_ffffffffffffe010;
  uint in_stack_ffffffffffffe014;
  undefined8 in_stack_ffffffffffffe098;
  allocator *paVar13;
  undefined4 in_stack_ffffffffffffe0a0;
  uint in_stack_ffffffffffffe0a4;
  int local_1e9c;
  ggvector<unsigned_char> local_1e98;
  void *local_1e88;
  uint local_1e80;
  uint local_1e7c;
  GGWave local_1e78 [1468];
  ggwave_Parameters local_18bc;
  uint local_1898;
  int local_1894;
  ggvector<unsigned_char> local_1890;
  void *local_1880;
  uint local_1878;
  uint local_1874;
  GGWave local_1870 [1464];
  ggwave_Parameters local_12b8;
  uint local_1294;
  Protocol *local_1290;
  int local_1284;
  reference local_1280;
  _Self local_1278;
  _Self local_1270;
  set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
  *local_1268;
  reference local_1260;
  _Self local_1258;
  _Self local_1250;
  set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
  *local_1248;
  allocator local_1239;
  string local_1238 [36];
  int local_1214;
  ggvector<unsigned_char> local_1210;
  GGWave local_1200 [1464];
  void *local_c48;
  uint local_c40;
  uint local_c3c;
  GGWave local_c38 [1471];
  allocator local_679;
  string local_678 [32];
  ggwave_Parameters local_658;
  uint local_630;
  allocator local_629;
  string local_628 [48];
  GGWave local_5f8 [1464];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  byte local_11;
  int local_4;
  
  local_4 = 0;
  local_11 = 0;
  if ((1 < in_EDI) && (iVar4 = strcmp(*(char **)(in_RSI + 8),"--full"), iVar4 == 0)) {
    local_11 = 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10c83f);
  local_40 = &local_30;
  local_38 = &local_30;
  pgVar8 = (ggwave_Parameters *)GGWave::getDefaultParameters();
  GGWave::GGWave(local_5f8,pgVar8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"hello",&local_629);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  gVar5 = std::__cxx11::string::c_str();
  bVar2 = GGWave::init((char *)local_5f8,gVar5,1);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
            ,0xb9,"instance.init(payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST)");
    exit(1);
  }
  bVar2 = GGWave::init((int)local_5f8,(char *)0xffffffff,0x1191ab,1);
  if ((bVar2 & 1) != 0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
            ,0xbc,"!(instance.init(-1, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST))");
    exit(1);
  }
  bVar2 = GGWave::init((int)local_5f8,(char *)0x0,GGWAVE_PROTOCOL_AUDIBLE_NORMAL,1);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
            ,0xbd,"instance.init(0, nullptr, GGWAVE_PROTOCOL_AUDIBLE_FAST)");
    exit(1);
  }
  bVar2 = GGWave::init((int)local_5f8,(char *)0x0,0x1191ab,1);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
            ,0xbe,"instance.init(0, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)");
    exit(1);
  }
  bVar2 = GGWave::init((int)local_5f8,(char *)0x1,0x1191ab,1);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
            ,0xbf,"instance.init(1, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)");
    exit(1);
  }
  bVar2 = GGWave::init((int)local_5f8,(char *)0x2,0x1191ab,1);
  if ((bVar2 & 1) == 0) {
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
            ,0xc0,"instance.init(2, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)");
    exit(1);
  }
  bVar2 = GGWave::init((int)local_5f8,(char *)0x3,0x1191ab,1);
  if ((bVar2 & 1) != 0) {
    uVar6 = std::__cxx11::string::size();
    gVar5 = std::__cxx11::string::c_str();
    bVar2 = GGWave::init((int)local_5f8,(char *)(ulong)uVar6,gVar5,1);
    if ((bVar2 & 1) != 0) {
      fprintf(_stderr,"[%s:%d] Check failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
              ,0xc4,
              "!(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, -1))")
      ;
      exit(1);
    }
    uVar6 = std::__cxx11::string::size();
    gVar5 = std::__cxx11::string::c_str();
    bVar2 = GGWave::init((int)local_5f8,(char *)(ulong)uVar6,gVar5,1);
    if ((bVar2 & 1) == 0) {
      fprintf(_stderr,"[%s:%d] Check failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
              ,0xc5,
              "instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 0)");
      exit(1);
    }
    uVar6 = std::__cxx11::string::size();
    gVar5 = std::__cxx11::string::c_str();
    bVar2 = GGWave::init((int)local_5f8,(char *)(ulong)uVar6,gVar5,1);
    if ((bVar2 & 1) == 0) {
      fprintf(_stderr,"[%s:%d] Check failed: %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
              ,0xc6,
              "instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 50)");
      exit(1);
    }
    uVar6 = std::__cxx11::string::size();
    gVar5 = std::__cxx11::string::c_str();
    bVar2 = GGWave::init((int)local_5f8,(char *)(ulong)uVar6,gVar5,1);
    if ((bVar2 & 1) != 0) {
      uVar6 = std::__cxx11::string::size();
      gVar5 = std::__cxx11::string::c_str();
      bVar2 = GGWave::init((int)local_5f8,(char *)(ulong)uVar6,gVar5,1);
      if ((bVar2 & 1) != 0) {
        fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                ,200,
                "!(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 101))"
               );
        exit(1);
      }
      std::__cxx11::string::~string(local_628);
      GGWave::~GGWave(local_5f8);
      for (local_630 = 8000; (float)(int)local_630 <= 96000.0; local_630 = local_630 + 0x55b) {
        printf("Testing: sample rate = %d\n",(ulong)local_630);
        puVar9 = (undefined8 *)GGWave::getDefaultParameters();
        local_658.operatingMode = *(int *)(puVar9 + 4);
        local_658._0_8_ = *puVar9;
        local_658._8_8_ = puVar9[1];
        local_658._24_8_ = puVar9[3];
        local_658.samplesPerFrame = (int)puVar9[2];
        local_658.soundMarkerThreshold = 3.0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_678,"hello123",&local_679);
        std::allocator<char>::~allocator((allocator<char> *)&local_679);
        local_658.sampleRateOut = (float)(int)local_630;
        GGWave::GGWave(local_c38,&local_658);
        gVar5 = std::__cxx11::string::c_str();
        GGWave::init((char *)local_c38,gVar5,8);
        local_c3c = GGWave::encodeSize_bytes();
        local_c40 = GGWave::encode();
        printf("Expected = %d, actual = %d\n",(ulong)local_c3c,(ulong)local_c40);
        if (local_c3c < local_c40) {
          fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                  ,0xdd,"expectedSize >= nBytes");
          exit(1);
        }
        local_c48 = (void *)GGWave::txWaveform();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (in_stack_ffffffffffffe000,(size_type)in_stack_ffffffffffffdff8);
        puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10d1ac);
        memcpy(puVar10,local_c48,(ulong)local_c40);
        main::anon_class_8_1_4eff857e::operator()
                  ((anon_class_8_1_4eff857e *)
                   CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                   (float)((ulong)in_stack_ffffffffffffe098 >> 0x20),
                   (SampleFormat)in_stack_ffffffffffffe098);
        main::anon_class_8_1_4eff857e::operator()
                  ((anon_class_8_1_4eff857e *)
                   CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010),
                   (SampleFormat)((ulong)in_stack_ffffffffffffe008 >> 0x20),
                   (SampleFormat)in_stack_ffffffffffffe008);
        GGWave::~GGWave(local_c38);
        local_658.sampleRateInp = (float)(int)local_630;
        GGWave::GGWave(local_1200,&local_658);
        gVar5 = GGWave::rxProtocols();
        GGWave::Protocols::only(gVar5);
        puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10d276);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_30);
        GGWave::decode(local_1200,(uint)puVar10);
        ggvector<unsigned_char>::ggvector(&local_1210);
        iVar4 = GGWave::rxTakeData((ggvector *)local_1200);
        iVar7 = std::__cxx11::string::size();
        if (iVar4 != iVar7) {
          fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                  ,0xec,"instanceInp.rxTakeData(result) == (int) payload.size()");
          exit(1);
        }
        for (local_1214 = 0; iVar4 = local_1214, iVar7 = std::__cxx11::string::size(), iVar4 < iVar7
            ; local_1214 = local_1214 + 1) {
          pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_678);
          in_stack_ffffffffffffe0a4 = (uint)*pcVar11;
          pbVar12 = ggvector<unsigned_char>::operator[](&local_1210,local_1214);
          if (in_stack_ffffffffffffe0a4 != *pbVar12) {
            fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                    ,0xee,"payload[i] == result[i]");
            exit(1);
          }
        }
        GGWave::~GGWave(local_1200);
        std::__cxx11::string::~string(local_678);
      }
      paVar13 = &local_1239;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1238,"a0Z5kR2g",paVar13);
      std::allocator<char>::~allocator((allocator<char> *)&local_1239);
      local_1248 = &kFormats;
      local_1250._M_node =
           (_Base_ptr)
           std::
           set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
           ::begin(in_stack_ffffffffffffdfd8);
      local_1258._M_node =
           (_Base_ptr)
           std::
           set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
           ::end(in_stack_ffffffffffffdfd8);
      do {
        bVar3 = std::operator!=(&local_1250,&local_1258);
        if (!bVar3) {
          local_4 = 0;
          std::__cxx11::string::~string(local_1238);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffdff4,in_stack_ffffffffffffdff0));
          return local_4;
        }
        local_1260 = std::_Rb_tree_const_iterator<ggwave_SampleFormat>::operator*
                               ((_Rb_tree_const_iterator<ggwave_SampleFormat> *)0x10d505);
        local_1268 = &kFormats;
        local_1270._M_node =
             (_Base_ptr)
             std::
             set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
             ::begin(in_stack_ffffffffffffdfd8);
        local_1278._M_node =
             (_Base_ptr)
             std::
             set<ggwave_SampleFormat,_std::less<ggwave_SampleFormat>,_std::allocator<ggwave_SampleFormat>_>
             ::end(in_stack_ffffffffffffdfd8);
        while (bVar3 = std::operator!=(&local_1270,&local_1278), bVar3) {
          local_1280 = std::_Rb_tree_const_iterator<ggwave_SampleFormat>::operator*
                                 ((_Rb_tree_const_iterator<ggwave_SampleFormat> *)0x10d56f);
          if (((local_11 & 1) != 0) ||
             ((*local_1260 == GGWAVE_OPERATING_MODE_TX && (*local_1280 == GGWAVE_SAMPLE_FORMAT_F32))
             )) {
            for (local_1284 = 0; local_1284 < 0x16; local_1284 = local_1284 + 1) {
              this = GGWave::Protocols::kDefault();
              local_1290 = GGWave::Protocols::operator[](this,local_1284);
              if ((local_1290->enabled & 1U) != 0) {
                printf("Testing: protocol = %s, in = %d, out = %d\n",local_1290->name,
                       (ulong)*local_1280,(ulong)*local_1260);
                local_1294 = 1;
                while ((uVar6 = local_1294, iVar4 = std::__cxx11::string::size(),
                       (int)uVar6 <= iVar4 && (local_1290->extra != '\x02'))) {
                  puVar9 = (undefined8 *)GGWave::getDefaultParameters();
                  local_12b8.operatingMode = *(int *)(puVar9 + 4);
                  local_12b8._0_8_ = *puVar9;
                  local_12b8._8_8_ = puVar9[1];
                  local_12b8._16_8_ = puVar9[2];
                  local_12b8.sampleFormatOut = *local_1260;
                  local_12b8.sampleFormatInp = *local_1280;
                  GGWave::GGWave(local_1870,&local_12b8);
                  gVar5 = GGWave::rxProtocols();
                  GGWave::Protocols::only(gVar5);
                  uVar6 = local_1294;
                  gVar5 = std::__cxx11::string::data();
                  GGWave::init((int)local_1870,(char *)(ulong)uVar6,gVar5,local_1284);
                  local_1874 = GGWave::encodeSize_bytes();
                  local_1878 = GGWave::encode();
                  printf("Expected = %d, actual = %d\n",(ulong)local_1874,(ulong)local_1878);
                  if (local_1874 != local_1878) {
                    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                            ,0x116,"expectedSize == nBytes");
                    exit(1);
                  }
                  local_1880 = (void *)GGWave::txWaveform();
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (in_stack_ffffffffffffe000,(size_type)in_stack_ffffffffffffdff8);
                  puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       0x10d8d6);
                  memcpy(puVar10,local_1880,(ulong)local_1878);
                  main::anon_class_8_1_4eff857e::operator()
                            ((anon_class_8_1_4eff857e *)
                             CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                             (float)((ulong)paVar13 >> 0x20),(SampleFormat)paVar13);
                  main::anon_class_8_1_4eff857e::operator()
                            ((anon_class_8_1_4eff857e *)
                             CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010),
                             (SampleFormat)((ulong)in_stack_ffffffffffffe008 >> 0x20),
                             (SampleFormat)in_stack_ffffffffffffe008);
                  puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       0x10d942);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_30);
                  GGWave::decode(local_1870,(uint)puVar10);
                  ggvector<unsigned_char>::ggvector(&local_1890);
                  uVar6 = GGWave::rxTakeData((ggvector *)local_1870);
                  if (uVar6 != local_1294) {
                    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                            ,0x11d,"instance.rxTakeData(result) == length");
                    exit(1);
                  }
                  for (local_1894 = 0; local_1894 < (int)local_1294; local_1894 = local_1894 + 1) {
                    pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_1238);
                    cVar1 = *pcVar11;
                    pbVar12 = ggvector<unsigned_char>::operator[](&local_1890,local_1894);
                    if ((int)cVar1 != (uint)*pbVar12) {
                      fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                              ,0x11f,"payload[i] == result[i]");
                      exit(1);
                    }
                  }
                  GGWave::~GGWave(local_1870);
                  local_1294 = local_1294 + 1;
                }
                for (local_1898 = 1; uVar6 = local_1898, iVar4 = std::__cxx11::string::size(),
                    (int)uVar6 <= iVar4; local_1898 = local_1898 + 1) {
                  __src = (void *)GGWave::getDefaultParameters();
                  memcpy(&local_18bc,__src,0x24);
                  local_18bc.payloadLength = local_1898;
                  local_18bc.sampleFormatInp = *local_1280;
                  local_18bc.sampleFormatOut = *local_1260;
                  iVar4 = rand();
                  if (iVar4 % 2 == 0) {
                    local_18bc.operatingMode = local_18bc.operatingMode | 0x10;
                  }
                  GGWave::GGWave(local_1e78,&local_18bc);
                  gVar5 = GGWave::rxProtocols();
                  GGWave::Protocols::only(gVar5);
                  uVar6 = local_1898;
                  gVar5 = std::__cxx11::string::data();
                  GGWave::init((int)local_1e78,(char *)(ulong)uVar6,gVar5,local_1284);
                  local_1e7c = GGWave::encodeSize_bytes();
                  in_stack_ffffffffffffe014 = GGWave::encode();
                  local_1e80 = in_stack_ffffffffffffe014;
                  printf("Expected = %d, actual = %d\n",(ulong)local_1e7c,
                         (ulong)in_stack_ffffffffffffe014);
                  if (local_1e7c != local_1e80) {
                    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                            ,0x133,"expectedSize == nBytes");
                    exit(1);
                  }
                  in_stack_ffffffffffffe008 = (void *)GGWave::txWaveform();
                  local_1e88 = in_stack_ffffffffffffe008;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (in_stack_ffffffffffffe000,(size_type)in_stack_ffffffffffffdff8);
                  puVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       0x10dcd5);
                  memcpy(puVar10,local_1e88,(ulong)local_1e80);
                  main::anon_class_8_1_4eff857e::operator()
                            ((anon_class_8_1_4eff857e *)
                             CONCAT44(in_stack_ffffffffffffe0a4,in_stack_ffffffffffffe0a0),
                             (float)((ulong)paVar13 >> 0x20),(SampleFormat)paVar13);
                  main::anon_class_8_1_4eff857e::operator()
                            ((anon_class_8_1_4eff857e *)
                             CONCAT44(in_stack_ffffffffffffe014,in_stack_ffffffffffffe010),
                             (SampleFormat)((ulong)in_stack_ffffffffffffe008 >> 0x20),
                             (SampleFormat)in_stack_ffffffffffffe008);
                  in_stack_ffffffffffffdff8 = &local_30;
                  in_stack_ffffffffffffe000 =
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10dd41)
                  ;
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            (in_stack_ffffffffffffdff8);
                  GGWave::decode(local_1e78,(uint)in_stack_ffffffffffffe000);
                  ggvector<unsigned_char>::ggvector(&local_1e98);
                  in_stack_ffffffffffffdff4 = GGWave::rxTakeData((ggvector *)local_1e78);
                  if (in_stack_ffffffffffffdff4 != local_1898) {
                    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                            ,0x13a,"instance.rxTakeData(result) == length");
                    exit(1);
                  }
                  for (local_1e9c = 0; local_1e9c < (int)local_1898; local_1e9c = local_1e9c + 1) {
                    pcVar11 = (char *)std::__cxx11::string::operator[]((ulong)local_1238);
                    in_stack_ffffffffffffdfe4 = (uint)*pcVar11;
                    pbVar12 = ggvector<unsigned_char>::operator[](&local_1e98,local_1e9c);
                    if (in_stack_ffffffffffffdfe4 != *pbVar12) {
                      fprintf(_stderr,"[%s:%d] Check failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
                              ,0x13c,"payload[i] == result[i]");
                      exit(1);
                    }
                  }
                  GGWave::~GGWave(local_1e78);
                }
              }
            }
          }
          std::_Rb_tree_const_iterator<ggwave_SampleFormat>::operator++
                    ((_Rb_tree_const_iterator<ggwave_SampleFormat> *)
                     CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
        }
        std::_Rb_tree_const_iterator<ggwave_SampleFormat>::operator++
                  ((_Rb_tree_const_iterator<ggwave_SampleFormat> *)
                   CONCAT44(in_stack_ffffffffffffdfe4,in_stack_ffffffffffffdfe0));
      } while( true );
    }
    fprintf(_stderr,"[%s:%d] Check failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
            ,199,"instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 100)"
           );
    exit(1);
  }
  fprintf(_stderr,"[%s:%d] Check failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggwave/tests/test-ggwave.cpp"
          ,0xc1,"instance.init(3, \"asd\", GGWAVE_PROTOCOL_AUDIBLE_FAST)");
  exit(1);
}

Assistant:

int main(int argc, char ** argv) {
    bool full = false;
    if (argc > 1) {
        if (strcmp(argv[1], "--full") == 0) {
            full = true;
        }
    }

    std::vector<uint8_t> buffer;

    auto convertHelper = [&](GGWave::SampleFormat formatOut, GGWave::SampleFormat formatInp) {
        switch (formatOut) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint8_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<uint8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int8_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int8_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<int8_t, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int8_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<uint16_t, uint8_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<uint16_t, int8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<uint16_t, int16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<uint16_t, float>  (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<int16_t, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<int16_t, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<int16_t, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       convert<int16_t, float>   (buffer); break;
                    };
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    switch (formatInp) {
                        case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
                        case GGWAVE_SAMPLE_FORMAT_U8:        convert<float, uint8_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I8:        convert<float, int8_t>  (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_U16:       convert<float, uint16_t>(buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_I16:       convert<float, int16_t> (buffer); break;
                        case GGWAVE_SAMPLE_FORMAT_F32:       break;
                    };
                } break;
        };
    };

    auto addNoiseHelper = [&](float level, GGWave::SampleFormat format) {
        switch (format) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: CHECK(false); break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    const int n = buffer.size()/sizeof(uint8_t);
                    auto p = (uint8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(255.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    const int n = buffer.size()/sizeof(int8_t);
                    auto p = (int8_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-128.0f, std::min(127.0f, (float) p[i] + (frand() - 0.5f)*(level*256)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    const int n = buffer.size()/sizeof(uint16_t);
                    auto p = (uint16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(0.0f, std::min(65535.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    const int n = buffer.size()/sizeof(int16_t);
                    auto p = (int16_t *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-32768.0f, std::min(32767.0f, (float) p[i] + (frand() - 0.5f)*(level*65536)));
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    const int n = buffer.size()/sizeof(float);
                    auto p = (float *) buffer.data();
                    for (int i = 0; i < n; ++i) {
                        p[i] = std::max(-1.0f, std::min(1.0f, p[i] + (frand() - 0.5f)*(level)));
                    }
                } break;
        };
    };

    {
        GGWave instance(GGWave::getDefaultParameters());

        std::string payload = "hello";

        CHECK(instance.init(payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // data
        CHECK_F(instance.init(-1, "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  nullptr, GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(0,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(1,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(2,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));
        CHECK_T(instance.init(3,  "asd",   GGWAVE_PROTOCOL_AUDIBLE_FAST));

        // volume
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, -1));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 0));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 50));
        CHECK_T(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 100));
        CHECK_F(instance.init(payload.size(), payload.c_str(), GGWAVE_PROTOCOL_AUDIBLE_FAST, 101));
    }

    // playback / capture at different sample rates
    for (int srInp = GGWave::kDefaultSampleRate/6; srInp <= 2*GGWave::kDefaultSampleRate; srInp += 1371) {
        printf("Testing: sample rate = %d\n", srInp);

        auto parameters = GGWave::getDefaultParameters();
        parameters.soundMarkerThreshold = 3.0f;

        const std::string payload = "hello123";

        // encode
        {
            parameters.sampleRateOut = srInp;
            GGWave instanceOut(parameters);

            instanceOut.init(payload.c_str(), GGWAVE_PROTOCOL_DT_FASTEST, 25);
            const auto expectedSize = instanceOut.encodeSize_bytes();
            const auto nBytes = instanceOut.encode();
            printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
            CHECK(expectedSize >= nBytes);
            { auto p = (const uint8_t *)(instanceOut.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
            addNoiseHelper(0.01, parameters.sampleFormatOut); // add some artificial noise
            convertHelper(parameters.sampleFormatOut, parameters.sampleFormatInp);
        }

        // decode
        {
            parameters.sampleRateInp = srInp;
            GGWave instanceInp(parameters);
            instanceInp.rxProtocols().only(GGWAVE_PROTOCOL_DT_FASTEST);

            instanceInp.decode(buffer.data(), buffer.size());

            GGWave::TxRxData result;
            CHECK(instanceInp.rxTakeData(result) == (int) payload.size());
            for (int i = 0; i < (int) payload.size(); ++i) {
                CHECK(payload[i] == result[i]);
            }
        }
    }

    const std::string payload = "a0Z5kR2g";

    // encode / decode using different sample formats and Tx protocols
    for (const auto & formatOut : kFormats) {
        for (const auto & formatInp : kFormats) {
            if (full == false) {
                if (formatOut != GGWAVE_SAMPLE_FORMAT_I16) continue;
                if (formatInp != GGWAVE_SAMPLE_FORMAT_F32) continue;
            }
            for (int protocolId = 0; protocolId < GGWAVE_PROTOCOL_COUNT; ++protocolId) {
                const auto & protocol = GGWave::Protocols::kDefault()[protocolId];
                if (protocol.enabled == false) continue;
                printf("Testing: protocol = %s, in = %d, out = %d\n", protocol.name, formatInp, formatOut);

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // mono-tone protocols with variable length are not supported
                    if (protocol.extra == 2) {
                        break;
                    }

                    // variable payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        // it seems DSS is not suitable for "variable-length" transmission
                        // sometimes, the decoder incorrectly detects an early "end" marker when DSS is enabled
                        //if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 25);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.02, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }

                for (int length = 1; length <= (int) payload.size(); ++length) {
                    // fixed payload length
                    {
                        auto parameters = GGWave::getDefaultParameters();
                        parameters.payloadLength = length;
                        parameters.sampleFormatInp = formatInp;
                        parameters.sampleFormatOut = formatOut;
                        if (rand() % 2 == 0) parameters.operatingMode |= GGWAVE_OPERATING_MODE_USE_DSS;
                        GGWave instance(parameters);
                        instance.rxProtocols().only(GGWave::ProtocolId(protocolId));

                        instance.init(length, payload.data(), GGWave::ProtocolId(protocolId), 10);
                        const auto expectedSize = instance.encodeSize_bytes();
                        const auto nBytes = instance.encode();
                        printf("Expected = %d, actual = %d\n", expectedSize, nBytes);
                        CHECK(expectedSize == nBytes);
                        { auto p = (const uint8_t *)(instance.txWaveform()); buffer.resize(nBytes); memcpy(buffer.data(), p, nBytes); }
                        addNoiseHelper(0.10, parameters.sampleFormatOut); // add some artificial noise
                        convertHelper(formatOut, formatInp);
                        instance.decode(buffer.data(), buffer.size());

                        GGWave::TxRxData result;
                        CHECK(instance.rxTakeData(result) == length);
                        for (int i = 0; i < length; ++i) {
                            CHECK(payload[i] == result[i]);
                        }
                    }
                }
            }
        }
    }

    return 0;
}